

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ImGuiTabBar *pIVar4;
  ImGuiTabBar *__dest;
  int iVar5;
  
  iVar2 = this->FreeIdx;
  iVar5 = (this->Buf).Size;
  if (iVar2 == iVar5) {
    iVar1 = iVar5 + 1;
    iVar3 = (this->Buf).Capacity;
    if (iVar3 <= iVar5) {
      if (iVar3 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar3 / 2 + iVar3;
      }
      if (iVar5 <= iVar1) {
        iVar5 = iVar1;
      }
      if (iVar3 < iVar5) {
        __dest = (ImGuiTabBar *)ImGui::MemAlloc((long)iVar5 * 0xa0);
        pIVar4 = (this->Buf).Data;
        if (pIVar4 != (ImGuiTabBar *)0x0) {
          memcpy(__dest,pIVar4,(long)(this->Buf).Size * 0xa0);
          ImGui::MemFree((this->Buf).Data);
        }
        (this->Buf).Data = __dest;
        (this->Buf).Capacity = iVar5;
      }
    }
    (this->Buf).Size = iVar1;
    iVar5 = this->FreeIdx + 1;
  }
  else {
    iVar5 = (this->Buf).Data[iVar2].Tabs.Size;
  }
  this->FreeIdx = iVar5;
  pIVar4 = (this->Buf).Data;
  memset(pIVar4 + iVar2,0,0xa0);
  pIVar4[iVar2].CurrFrameVisible = -1;
  pIVar4[iVar2].PrevFrameVisible = -1;
  pIVar4[iVar2].LastTabItemIdx = -1;
  this->AliveCount = this->AliveCount + 1;
  return (this->Buf).Data + iVar2;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }